

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void __thiscall
BasicBuildSystemFrontendDelegate::cycleDetected
          (BasicBuildSystemFrontendDelegate *this,
          vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_> *items)

{
  vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_> *in_RDX;
  string message;
  string local_50;
  Twine local_30;
  
  llbuild::buildsystem::BuildSystemInvocation::formatDetectedCycle_abi_cxx11_
            (&local_50,(BuildSystemInvocation *)items,in_RDX);
  llvm::Twine::Twine(&local_30,&local_50);
  llbuild::buildsystem::BuildSystemFrontendDelegate::error
            (&this->super_BuildSystemFrontendDelegate,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

virtual void cycleDetected(const std::vector<core::Rule*>& items) override {
    auto message = BuildSystemInvocation::formatDetectedCycle(items);
    error(message);
  }